

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

bool __thiscall
AddrManImpl::Add(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                CNetAddr *source,seconds time_penalty)

{
  long lVar1;
  bool bVar2;
  AddrManImpl *in_RDX;
  char *in_RSI;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_00000008;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_00000010;
  bool ret;
  AddrManImpl *in_stack_00000018;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  seconds in_stack_00000068;
  Mutex *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffd8,in_RDI,in_RSI,(char *)in_RDX,in_stack_ffffffffffffffbc,
             (bool)in_stack_ffffffffffffffbb);
  Check(in_RDX);
  bVar2 = Add_(in_stack_00000018,in_stack_00000010,in_stack_00000008,in_stack_00000068);
  Check(in_RDX);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::Add(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    LOCK(cs);
    Check();
    auto ret = Add_(vAddr, source, time_penalty);
    Check();
    return ret;
}